

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O2

LY_ERR parse_leaf(lysp_yang_ctx *ctx,lysp_node *parent,lysp_node **siblings)

{
  lysp_ext_instance **exts;
  lysp_node *plVar1;
  LY_ERR LVar2;
  lysp_node *parent_00;
  lysp_node *plVar3;
  char *pcVar4;
  lysp_ext_instance **pplVar5;
  char *format;
  lysp_restr **extraout_RDX;
  lysp_restr **extraout_RDX_00;
  lysp_restr **restrs;
  lysp_restr **extraout_RDX_01;
  lysp_restr **extraout_RDX_02;
  ly_ctx *plVar6;
  lysp_ext_instance *parent_01;
  lysp_ext_instance **exts_00;
  ly_stmt lVar7;
  bool bVar8;
  undefined4 uStack_a0;
  ly_stmt kw;
  char *word;
  size_t word_len;
  uint16_t *local_88;
  lysp_type *local_80;
  lysp_node **local_78;
  lysp_node *local_70;
  lysp_ext_instance **local_68;
  lysp_qname **local_60;
  lysp_node *local_58;
  lysp_ext_instance **local_50;
  lysp_ext_instance **local_48;
  uint16_t *local_40;
  char *buf;
  
  parent_00 = (lysp_node *)calloc(1,0xd8);
  if (parent_00 == (lysp_node *)0x0) {
    if (ctx == (lysp_yang_ctx *)0x0) {
      plVar6 = (ly_ctx *)0x0;
    }
    else {
      plVar6 = (ly_ctx *)
               **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
    }
    LVar2 = LY_EMEM;
    ly_log(plVar6,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","parse_leaf");
  }
  else {
    plVar1 = *siblings;
    if (*siblings != (lysp_node *)0x0) {
      do {
        plVar3 = plVar1;
        plVar1 = plVar3->next;
      } while (plVar1 != (lysp_node *)0x0);
      siblings = &plVar3->next;
    }
    *siblings = parent_00;
    parent_00->nodetype = 4;
    parent_00->parent = parent;
    exts_00 = (lysp_ext_instance **)&buf;
    LVar2 = get_argument(ctx,Y_IDENTIF_ARG,(uint16_t *)0x0,&word,(char **)exts_00,&word_len);
    if (LVar2 != LY_SUCCESS) {
      return LVar2;
    }
    if (buf == (char *)0x0) {
      if (ctx == (lysp_yang_ctx *)0x0) {
        plVar6 = (ly_ctx *)0x0;
      }
      else {
        plVar6 = (ly_ctx *)
                 **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
      }
      pcVar4 = word;
      if (word_len == 0) {
        pcVar4 = "";
      }
      LVar2 = lydict_insert(plVar6,pcVar4,word_len,&parent_00->name);
    }
    else {
      if (ctx == (lysp_yang_ctx *)0x0) {
        plVar6 = (ly_ctx *)0x0;
      }
      else {
        plVar6 = (ly_ctx *)
                 **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
      }
      LVar2 = lydict_insert_zc(plVar6,word,&parent_00->name);
    }
    if (LVar2 != LY_SUCCESS) {
      return LVar2;
    }
    LVar2 = get_keyword(ctx,&kw,&word,&word_len);
    if (LVar2 != LY_SUCCESS) {
      return LVar2;
    }
    if (kw == LY_STMT_SYNTAX_SEMICOLON) {
      bVar8 = false;
      restrs = extraout_RDX;
    }
    else {
      if (kw != LY_STMT_SYNTAX_LEFT_BRACE) {
        if (ctx == (lysp_yang_ctx *)0x0) {
          plVar6 = (ly_ctx *)0x0;
        }
        else {
          plVar6 = (ly_ctx *)
                   **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
        }
        pcVar4 = lyplg_ext_stmt2str(kw);
        ly_vlog(plVar6,(char *)0x0,LYVE_SYNTAX_YANG,
                "Invalid keyword \"%s\", expected \";\" or \"{\".",pcVar4);
        return LY_EVALID;
      }
      LVar2 = get_keyword(ctx,&kw,&word,&word_len);
      if (LVar2 != LY_SUCCESS) {
        return LVar2;
      }
      bVar8 = kw != LY_STMT_SYNTAX_RIGHT_BRACE;
      restrs = extraout_RDX_00;
    }
    exts = &parent_00->exts;
    local_40 = &parent_00[1].nodetype;
    local_48 = &parent_00[2].exts;
    local_80 = (lysp_type *)&parent_00[1].next;
    local_88 = &parent_00->flags;
    local_50 = (lysp_ext_instance **)&parent_00->ref;
    local_58 = parent_00 + 1;
    local_60 = &parent_00->iffeatures;
    local_68 = (lysp_ext_instance **)&parent_00->dsc;
    local_70 = parent_00 + 3;
    local_78 = &parent_00[3].next;
    lVar7 = kw;
    while (bVar8) {
      if (lVar7 == LY_STMT_WHEN) {
        LVar2 = parse_when(ctx,(lysp_when **)local_40);
LAB_0016dc8a:
        if (LVar2 != LY_SUCCESS) {
          return LVar2;
        }
      }
      else {
        if (lVar7 != LY_STMT_DEFAULT) {
          if (lVar7 == LY_STMT_DESCRIPTION) {
            parent_01 = *local_68;
            lVar7 = LY_STMT_DESCRIPTION;
            pplVar5 = local_68;
            goto LAB_0016dc6f;
          }
          if (lVar7 == LY_STMT_EXTENSION_INSTANCE) {
            exts_00 = (lysp_ext_instance **)0x1000;
            LVar2 = parse_ext(ctx,word,word_len,parent_00,LY_STMT_LEAF,0,exts);
          }
          else if (lVar7 == LY_STMT_IF_FEATURE) {
            LVar2 = parse_qnames(ctx,LY_STMT_IF_FEATURE,local_60,(yang_arg)exts,exts_00);
          }
          else if (lVar7 == LY_STMT_MANDATORY) {
            LVar2 = parse_mandatory(ctx,local_88,exts);
          }
          else if (lVar7 == LY_STMT_MUST) {
            LVar2 = parse_restrs(ctx,(ly_stmt)local_58,restrs);
          }
          else if (lVar7 == LY_STMT_REFERENCE) {
            parent_01 = *local_50;
            lVar7 = LY_STMT_REFERENCE;
            pplVar5 = local_50;
LAB_0016dc6f:
            exts_00 = (lysp_ext_instance **)0x2;
            LVar2 = parse_text_field(ctx,parent_01,lVar7,(uint32_t)pplVar5,(char **)0x2,
                                     Y_IDENTIF_ARG,(uint16_t *)exts,
                                     (lysp_ext_instance **)CONCAT44(kw,uStack_a0));
          }
          else if (lVar7 == LY_STMT_STATUS) {
            LVar2 = parse_status(ctx,local_88,exts);
          }
          else if (lVar7 == LY_STMT_TYPE) {
            LVar2 = parse_type(ctx,local_80);
          }
          else {
            if (lVar7 == LY_STMT_UNITS) {
              parent_01 = *local_48;
              lVar7 = LY_STMT_UNITS;
              pplVar5 = local_48;
              goto LAB_0016dc6f;
            }
            if (lVar7 != LY_STMT_CONFIG) {
              if (ctx == (lysp_yang_ctx *)0x0) {
                plVar6 = (ly_ctx *)0x0;
              }
              else {
                plVar6 = (ly_ctx *)
                         **(undefined8 **)
                           (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
              }
              pcVar4 = lyplg_ext_stmt2str(lVar7);
              format = "Invalid keyword \"%s\" as a child of \"%s\".";
              goto LAB_0016dd8b;
            }
            LVar2 = parse_config(ctx,local_88,exts);
          }
          goto LAB_0016dc8a;
        }
        exts_00 = (lysp_ext_instance **)0x2;
        LVar2 = parse_text_field(ctx,local_70,LY_STMT_DEFAULT,(uint32_t)local_70,(char **)0x2,
                                 (yang_arg)local_78,(uint16_t *)exts,
                                 (lysp_ext_instance **)CONCAT44(kw,uStack_a0));
        if (LVar2 != LY_SUCCESS) {
          return LVar2;
        }
        *(lyd_node **)&parent_00[3].nodetype =
             (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
      }
      LVar2 = get_keyword(ctx,&kw,&word,&word_len);
      lVar7 = kw;
      if (LVar2 != LY_SUCCESS) {
        return LVar2;
      }
      bVar8 = kw != LY_STMT_SYNTAX_RIGHT_BRACE;
      restrs = extraout_RDX_01;
      if (((!bVar8) && (*exts != (lysp_ext_instance *)0x0)) &&
         (LVar2 = ly_set_add(&ctx->main_ctx->ext_inst,*exts,'\x01',(uint32_t *)0x0),
         restrs = extraout_RDX_02, LVar2 != LY_SUCCESS)) {
        return LVar2;
      }
    }
    LVar2 = LY_SUCCESS;
    if (local_80->name == (char *)0x0) {
      if (ctx == (lysp_yang_ctx *)0x0) {
        plVar6 = (ly_ctx *)0x0;
      }
      else {
        plVar6 = (ly_ctx *)
                 **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
      }
      format = "Missing mandatory keyword \"%s\" as a child of \"%s\".";
      pcVar4 = "type";
LAB_0016dd8b:
      ly_vlog(plVar6,(char *)0x0,LYVE_SYNTAX_YANG,format,pcVar4,"leaf");
      return LY_EVALID;
    }
  }
  return LVar2;
}

Assistant:

LY_ERR
parse_leaf(struct lysp_yang_ctx *ctx, struct lysp_node *parent, struct lysp_node **siblings)
{
    LY_ERR ret = LY_SUCCESS;
    char *buf, *word;
    size_t word_len;
    enum ly_stmt kw;
    struct lysp_node_leaf *leaf;

    /* create new leaf structure */
    LY_LIST_NEW_RET(PARSER_CTX(ctx), siblings, leaf, next, LY_EMEM);
    leaf->nodetype = LYS_LEAF;
    leaf->parent = parent;

    /* get name */
    LY_CHECK_RET(get_argument(ctx, Y_IDENTIF_ARG, NULL, &word, &buf, &word_len));
    INSERT_WORD_GOTO(ctx, buf, leaf->name, word, word_len, ret, cleanup);

    /* parse substatements */
    YANG_READ_SUBSTMT_FOR_GOTO(ctx, kw, word, word_len, ret, cleanup) {
        switch (kw) {
        case LY_STMT_CONFIG:
            LY_CHECK_RET(parse_config(ctx, &leaf->flags, &leaf->exts));
            break;
        case LY_STMT_DEFAULT:
            LY_CHECK_RET(parse_text_field(ctx, &leaf->dflt, LY_STMT_DEFAULT, 0, &leaf->dflt.str, Y_STR_ARG,
                    &leaf->dflt.flags, &leaf->exts));
            leaf->dflt.mod = PARSER_CUR_PMOD(ctx);
            break;
        case LY_STMT_DESCRIPTION:
            LY_CHECK_RET(parse_text_field(ctx, leaf->dsc, LY_STMT_DESCRIPTION, 0, &leaf->dsc, Y_STR_ARG, NULL, &leaf->exts));
            break;
        case LY_STMT_IF_FEATURE:
            LY_CHECK_RET(parse_qnames(ctx, LY_STMT_IF_FEATURE, &leaf->iffeatures, Y_STR_ARG, &leaf->exts));
            break;
        case LY_STMT_MANDATORY:
            LY_CHECK_RET(parse_mandatory(ctx, &leaf->flags, &leaf->exts));
            break;
        case LY_STMT_MUST:
            LY_CHECK_RET(parse_restrs(ctx, kw, &leaf->musts));
            break;
        case LY_STMT_REFERENCE:
            LY_CHECK_RET(parse_text_field(ctx, leaf->ref, LY_STMT_REFERENCE, 0, &leaf->ref, Y_STR_ARG, NULL, &leaf->exts));
            break;
        case LY_STMT_STATUS:
            LY_CHECK_RET(parse_status(ctx, &leaf->flags, &leaf->exts));
            break;
        case LY_STMT_TYPE:
            LY_CHECK_RET(parse_type(ctx, &leaf->type));
            break;
        case LY_STMT_UNITS:
            LY_CHECK_RET(parse_text_field(ctx, leaf->units, LY_STMT_UNITS, 0, &leaf->units, Y_STR_ARG, NULL, &leaf->exts));
            break;
        case LY_STMT_WHEN:
            LY_CHECK_RET(parse_when(ctx, &leaf->when));
            break;
        case LY_STMT_EXTENSION_INSTANCE:
            LY_CHECK_RET(parse_ext(ctx, word, word_len, leaf, LY_STMT_LEAF, 0, &leaf->exts));
            break;
        default:
            LOGVAL_PARSER(ctx, LY_VCODE_INCHILDSTMT, lyplg_ext_stmt2str(kw), "leaf");
            return LY_EVALID;
        }
        YANG_READ_SUBSTMT_NEXT_ITER(ctx, kw, word, word_len, leaf->exts, ret, cleanup);
    }

    /* mandatory substatements */
    if (!leaf->type.name) {
        LOGVAL_PARSER(ctx, LY_VCODE_MISSTMT, "type", "leaf");
        return LY_EVALID;
    }

cleanup:
    return ret;
}